

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

void Pdr_ManCollectCone(Aig_Man_t *pAig,Vec_Int_t *vCoObjs,Vec_Int_t *vCiObjs,Vec_Int_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  undefined4 local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCiObjs_local;
  Vec_Int_t *vCoObjs_local;
  Aig_Man_t *pAig_local;
  
  Vec_IntClear(vCiObjs);
  Vec_IntClear(vNodes);
  Aig_ManIncrementTravId(pAig);
  pAVar2 = Aig_ManConst1(pAig);
  Aig_ObjSetTravIdCurrent(pAig,pAVar2);
  for (local_34 = 0; iVar1 = Vec_IntSize(vCoObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vCoObjs,local_34);
    pAVar2 = Aig_ManObj(pAig,iVar1);
    Pdr_ManCollectCone_rec(pAig,pAVar2,vCiObjs,vNodes);
  }
  return;
}

Assistant:

void Pdr_ManCollectCone( Aig_Man_t * pAig, Vec_Int_t * vCoObjs, Vec_Int_t * vCiObjs, Vec_Int_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vCiObjs );
    Vec_IntClear( vNodes );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManCollectCone_rec( pAig, pObj, vCiObjs, vNodes );
}